

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_handle.cpp
# Opt level: O1

void CATCH2_INTERNAL_TEST_8(void)

{
  return_handler<bool_(int)> *prVar1;
  bool bVar2;
  modifier_t<trompeloeil_sig_t,_trompeloeil_l_tag_type_trompeloeil_28,_int>_conflict mVar3;
  return_handler<bool_(int)> *prVar4;
  modifier_t<trompeloeil_sig_t,_trompeloeil_l_tag_type_trompeloeil_27,_int>_conflict mVar5;
  modifier_t<trompeloeil_sig_t,_trompeloeil_l_tag_type_trompeloeil_30,_int>_conflict mVar6;
  modifier_t<trompeloeil_sig_t,_trompeloeil_l_tag_type_trompeloeil_29,_int>_conflict mVar7;
  trompeloeil_l_expectation_list_t_30 *this;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  unique_ptr<trompeloeil::expectation,_std::default_delete<trompeloeil::expectation>_>
  trompeloeil_c_call_obj_12;
  unique_ptr<trompeloeil::expectation,_std::default_delete<trompeloeil::expectation>_>
  trompeloeil_c_call_obj_11;
  sequence seq;
  AssertionHandler catchAssertionHandler;
  BasicClosure<sl::functional::Composition<sl::functional::ConjunctionStrategy,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>,_sl::functional::BasicInvokePolicy,_sl::functional::ConjunctionOperator>
  composedFun;
  call_matcher<bool_(int),_std::tuple<int>_> *local_4d0;
  long *local_4c8;
  SourceLineInfo local_4c0;
  call_matcher<bool_(int),_std::tuple<int>_> *local_4b0;
  list_elem<trompeloeil::call_matcher_base<bool_(int)>_> local_4a8;
  undefined1 local_490 [64];
  list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *local_450;
  Section local_3d0;
  GenericOperation1Mock<bool,_int> local_370;
  GenericOperation1Mock<bool,_int> local_2b0;
  type<std::remove_cvref_t<Composition<ConjunctionStrategy,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>_>_>
  local_1f0;
  StringRef local_70;
  StringRef local_60;
  StringRef local_50;
  StringRef local_40;
  
  memset(&local_2b0,0,0xc0);
  local_2b0.trompeloeil_l_expectations_27.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)&PTR__list_004f67d8;
  local_2b0.trompeloeil_l_expectations_27.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)
       &local_2b0.trompeloeil_l_expectations_27.saturated;
  local_2b0.trompeloeil_l_expectations_27.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)&PTR__list_004f67d8;
  local_2b0.trompeloeil_l_expectations_28.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)
       &local_2b0.trompeloeil_l_expectations_28;
  local_2b0.trompeloeil_l_expectations_28.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)&PTR__list_004f67d8;
  local_2b0.trompeloeil_l_expectations_28.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)
       &local_2b0.trompeloeil_l_expectations_28.saturated;
  local_2b0.trompeloeil_l_expectations_28.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)&PTR__list_004f67d8;
  local_2b0.trompeloeil_l_expectations_29.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)
       &local_2b0.trompeloeil_l_expectations_29;
  local_2b0.trompeloeil_l_expectations_29.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)&PTR__list_004f67d8;
  local_2b0.trompeloeil_l_expectations_29.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)
       &local_2b0.trompeloeil_l_expectations_29.saturated;
  local_2b0.trompeloeil_l_expectations_29.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)&PTR__list_004f67d8;
  local_4a8.prev =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)
       &local_2b0.trompeloeil_l_expectations_30;
  local_2b0.trompeloeil_l_expectations_30.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)&PTR__list_004f67d8;
  local_2b0.trompeloeil_l_expectations_30.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)
       &local_2b0.trompeloeil_l_expectations_30.saturated;
  local_2b0.trompeloeil_l_expectations_30.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)&PTR__list_004f67d8;
  local_2b0.trompeloeil_l_expectations_27.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)&local_2b0;
  local_2b0.trompeloeil_l_expectations_27.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)&local_2b0;
  local_2b0.trompeloeil_l_expectations_27.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
       local_2b0.trompeloeil_l_expectations_27.saturated.
       super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
       super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next;
  local_2b0.trompeloeil_l_expectations_28.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
       local_2b0.trompeloeil_l_expectations_28.active.
       super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
       super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next;
  local_2b0.trompeloeil_l_expectations_28.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
       local_2b0.trompeloeil_l_expectations_28.saturated.
       super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
       super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next;
  local_2b0.trompeloeil_l_expectations_29.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
       local_2b0.trompeloeil_l_expectations_29.active.
       super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
       super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next;
  local_2b0.trompeloeil_l_expectations_29.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
       local_2b0.trompeloeil_l_expectations_29.saturated.
       super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
       super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next;
  local_2b0.trompeloeil_l_expectations_30.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next = local_4a8.prev;
  local_2b0.trompeloeil_l_expectations_30.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev = local_4a8.prev;
  local_2b0.trompeloeil_l_expectations_30.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
       local_2b0.trompeloeil_l_expectations_30.saturated.
       super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
       super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next;
  memset(&local_370,0,0xc0);
  local_370.trompeloeil_l_expectations_27.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)&PTR__list_004f67d8;
  local_370.trompeloeil_l_expectations_27.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)
       &local_370.trompeloeil_l_expectations_27.saturated;
  local_370.trompeloeil_l_expectations_27.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)&PTR__list_004f67d8;
  local_370.trompeloeil_l_expectations_28.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)
       &local_370.trompeloeil_l_expectations_28;
  local_370.trompeloeil_l_expectations_28.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)&PTR__list_004f67d8;
  local_370.trompeloeil_l_expectations_28.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)
       &local_370.trompeloeil_l_expectations_28.saturated;
  local_370.trompeloeil_l_expectations_28.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)&PTR__list_004f67d8;
  local_370.trompeloeil_l_expectations_29.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)
       &local_370.trompeloeil_l_expectations_29;
  local_370.trompeloeil_l_expectations_29.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)&PTR__list_004f67d8;
  local_370.trompeloeil_l_expectations_29.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)
       &local_370.trompeloeil_l_expectations_29.saturated;
  local_370.trompeloeil_l_expectations_29.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)&PTR__list_004f67d8;
  this = &local_370.trompeloeil_l_expectations_30;
  local_370.trompeloeil_l_expectations_30.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)&PTR__list_004f67d8;
  local_370.trompeloeil_l_expectations_30.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)
       &local_370.trompeloeil_l_expectations_30.saturated;
  local_370.trompeloeil_l_expectations_30.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)&PTR__list_004f67d8;
  local_4a8._vptr_list_elem = (_func_int **)0x0;
  local_370.trompeloeil_l_expectations_27.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)&local_370;
  local_370.trompeloeil_l_expectations_27.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)&local_370;
  local_370.trompeloeil_l_expectations_27.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
       local_370.trompeloeil_l_expectations_27.saturated.
       super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
       super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next;
  local_370.trompeloeil_l_expectations_28.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
       local_370.trompeloeil_l_expectations_28.active.
       super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
       super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next;
  local_370.trompeloeil_l_expectations_28.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
       local_370.trompeloeil_l_expectations_28.saturated.
       super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
       super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next;
  local_370.trompeloeil_l_expectations_29.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
       local_370.trompeloeil_l_expectations_29.active.
       super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
       super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next;
  local_370.trompeloeil_l_expectations_29.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
       local_370.trompeloeil_l_expectations_29.saturated.
       super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
       super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next;
  local_370.trompeloeil_l_expectations_30.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)this;
  local_370.trompeloeil_l_expectations_30.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)this;
  local_370.trompeloeil_l_expectations_30.saturated.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
       local_370.trompeloeil_l_expectations_30.saturated.
       super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
       super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next;
  local_4a8._vptr_list_elem = (_func_int **)operator_new(0x18);
  *local_4a8._vptr_list_elem = (_func_int *)0x0;
  local_4a8._vptr_list_elem[1] = (_func_int *)0x0;
  local_4a8._vptr_list_elem[1] = (_func_int *)local_4a8._vptr_list_elem;
  local_4a8._vptr_list_elem[2] = (_func_int *)local_4a8._vptr_list_elem;
  *local_4a8._vptr_list_elem = (_func_int *)&PTR__list_004f6bb8;
  local_1f0.m_Fn.m_Functions.
  super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
  super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
  super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
  trompeloeil_l_expectations_27.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)0x46504a;
  local_1f0.m_Fn.m_Functions.
  super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
  super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
  super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
  trompeloeil_l_expectations_27.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)0x4b;
  Catch::StringRef::StringRef(&local_40,"Invoking as const lvalue ref.");
  Catch::Section::Section(&local_3d0,(SourceLineInfo *)&local_1f0,local_40,(char *)0x0);
  bVar2 = Catch::Section::operator_cast_to_bool(&local_3d0);
  if (bVar2) {
    local_1f0.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
         (_func_int **)0x46504a;
    local_1f0.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
         (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)0x4d;
    local_1f0.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
         (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)0x45f7be;
    local_4b0 = (call_matcher<bool_(int),_std::tuple<int>_> *)CONCAT44(local_4b0._4_4_,0x2a);
    local_4c0.file = (char *)&local_2b0;
    mVar3 = GenericOperation1Mock<bool,_int>::trompeloeil_l_tag_type_trompeloeil_28::
            call_const_lvalue_ref<int>
                      ((trompeloeil_l_tag_type_trompeloeil_28 *)&local_1f0,(int *)&local_4b0);
    prVar4 = (return_handler<bool_(int)> *)operator_new(0x10);
    prVar4->_vptr_return_handler = (_func_int **)&PTR__return_handler_004fa298;
    prVar1 = ((mVar3.matcher)->return_handler_obj)._M_t.
             super___uniq_ptr_impl<trompeloeil::return_handler<bool_(int)>,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_trompeloeil::return_handler<bool_(int)>_*,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
             .super__Head_base<0UL,_trompeloeil::return_handler<bool_(int)>_*,_false>._M_head_impl;
    ((mVar3.matcher)->return_handler_obj)._M_t.
    super___uniq_ptr_impl<trompeloeil::return_handler<bool_(int)>,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_trompeloeil::return_handler<bool_(int)>_*,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
    .super__Head_base<0UL,_trompeloeil::return_handler<bool_(int)>_*,_false>._M_head_impl = prVar4;
    if (prVar1 != (return_handler<bool_(int)> *)0x0) {
      (*prVar1->_vptr_return_handler[1])();
    }
    local_490._0_8_ = "seq";
    local_490._8_8_ = &local_4a8;
    trompeloeil::call_matcher<bool(int),std::tuple<int>>::
    set_sequence<std::pair<char_const*,trompeloeil::sequence&>>
              ((call_matcher<bool(int),std::tuple<int>> *)mVar3.matcher,
               (pair<const_char_*,_trompeloeil::sequence_&> *)local_490);
    local_4d0 = mVar3.matcher;
    trompeloeil::call_validator_t<GenericOperation1Mock<bool,int>const&>::
    make_expectation<trompeloeil::call_matcher<bool(int),std::tuple<int>>,GenericOperation1Mock<bool,int>::trompeloeil_l_tag_type_trompeloeil_28,trompeloeil::sequence_injector<trompeloeil::return_injector<bool,trompeloeil::matcher_info<bool(int)>>>>
              ((call_validator_t<GenericOperation1Mock<bool,int>const&> *)&local_4c8,&local_4c0);
    local_4c0.file = (char *)&local_370;
    local_1f0.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
         (_func_int **)0x46504a;
    local_1f0.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
         (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)0x51;
    local_1f0.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
         (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)0x45f7e0;
    local_4a8.next._4_4_ = 0x2a;
    mVar3 = GenericOperation1Mock<bool,_int>::trompeloeil_l_tag_type_trompeloeil_28::
            call_const_lvalue_ref<int>
                      ((trompeloeil_l_tag_type_trompeloeil_28 *)&local_1f0,
                       (int *)((long)&local_4a8.next + 4));
    prVar4 = (return_handler<bool_(int)> *)operator_new(0x10);
    prVar4->_vptr_return_handler = (_func_int **)&PTR__return_handler_004fa2d8;
    prVar1 = ((mVar3.matcher)->return_handler_obj)._M_t.
             super___uniq_ptr_impl<trompeloeil::return_handler<bool_(int)>,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_trompeloeil::return_handler<bool_(int)>_*,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
             .super__Head_base<0UL,_trompeloeil::return_handler<bool_(int)>_*,_false>._M_head_impl;
    ((mVar3.matcher)->return_handler_obj)._M_t.
    super___uniq_ptr_impl<trompeloeil::return_handler<bool_(int)>,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_trompeloeil::return_handler<bool_(int)>_*,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
    .super__Head_base<0UL,_trompeloeil::return_handler<bool_(int)>_*,_false>._M_head_impl = prVar4;
    if (prVar1 != (return_handler<bool_(int)> *)0x0) {
      (*prVar1->_vptr_return_handler[1])();
    }
    local_490._0_8_ = "seq";
    local_490._8_8_ = &local_4a8;
    trompeloeil::call_matcher<bool(int),std::tuple<int>>::
    set_sequence<std::pair<char_const*,trompeloeil::sequence&>>
              ((call_matcher<bool(int),std::tuple<int>> *)mVar3.matcher,
               (pair<const_char_*,_trompeloeil::sequence_&> *)local_490);
    local_4b0 = mVar3.matcher;
    trompeloeil::call_validator_t<GenericOperation1Mock<bool,int>const&>::
    make_expectation<trompeloeil::call_matcher<bool(int),std::tuple<int>>,GenericOperation1Mock<bool,int>::trompeloeil_l_tag_type_trompeloeil_28,trompeloeil::sequence_injector<trompeloeil::return_injector<bool,trompeloeil::matcher_info<bool(int)>>>>
              ((call_validator_t<GenericOperation1Mock<bool,int>const&> *)&local_4d0,&local_4c0);
    sl::functional::
    BasicClosure<GenericOperation1Mock<bool,_int>,_sl::functional::BasicInvokePolicy,_sl::functional::ConjunctionOperator>
    ::BasicClosure<GenericOperation1Mock<bool,_int>_>
              ((BasicClosure<GenericOperation1Mock<bool,_int>,_sl::functional::BasicInvokePolicy,_sl::functional::ConjunctionOperator>
                *)local_490,&local_2b0);
    sl::functional::operator&&<GenericOperation1Mock<bool,_int>_>
              (&local_1f0,
               (BasicClosure<GenericOperation1Mock<bool,_int>,_sl::functional::BasicInvokePolicy,_sl::functional::ConjunctionOperator>
                *)local_490,&local_370);
    sl::functional::
    BasicClosure<GenericOperation1Mock<bool,_int>,_sl::functional::BasicInvokePolicy,_sl::functional::ConjunctionOperator>
    ::~BasicClosure((BasicClosure<GenericOperation1Mock<bool,_int>,_sl::functional::BasicInvokePolicy,_sl::functional::ConjunctionOperator>
                     *)local_490);
    local_4c0.file = (char *)CONCAT44(local_4c0.file._4_4_,0x2a);
    local_490._0_8_ = &local_4c0;
    bVar2 = std::
            __invoke_impl<bool,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_DNKpp[P]Simple_Utility_include_Simple_Utility_functional_mixins_Conjunction_hpp:31:5),_const_GenericOperation1Mock<bool,_int>_&,_const_GenericOperation1Mock<bool,_int>_&>
                      (local_490,
                       &local_1f0.m_Fn.m_Functions.
                        super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>
                        .super__Head_base<0UL,_GenericOperation1Mock<bool,_int>,_false>,&local_1f0);
    local_4c0.file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/DNKpp[P]Simple-Utility/tests/functional/mixins/Conjunction.cpp"
    ;
    local_4c0.line = 0x5a;
    macroName.m_size = 7;
    macroName.m_start = "REQUIRE";
    capturedExpression.m_size = 7;
    capturedExpression.m_start = "!result";
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_490,macroName,&local_4c0,capturedExpression,Normal);
    local_4c0.file = (char *)CONCAT71(local_4c0.file._1_7_,!bVar2);
    Catch::AssertionHandler::handleExpr<bool>
              ((AssertionHandler *)local_490,(ExprLhs<bool> *)&local_4c0);
    Catch::AssertionHandler::complete((AssertionHandler *)local_490);
    if (local_490[0x3b] == false) {
      (*local_450->_vptr_list_elem[0x14])();
    }
    sl::functional::
    BasicClosure<sl::functional::Composition<sl::functional::ConjunctionStrategy,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>,_sl::functional::BasicInvokePolicy,_sl::functional::ConjunctionOperator>
    ::~BasicClosure(&local_1f0);
    if (local_4d0 != (call_matcher<bool_(int),_std::tuple<int>_> *)0x0) {
      (*(local_4d0->super_call_matcher_base<bool_(int)>).
        super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem[1])();
    }
    if (local_4c8 != (long *)0x0) {
      (**(code **)(*local_4c8 + 8))();
    }
  }
  Catch::Section::~Section(&local_3d0);
  local_1f0.m_Fn.m_Functions.
  super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
  super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
  super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
  trompeloeil_l_expectations_27.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)0x46504a;
  local_1f0.m_Fn.m_Functions.
  super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
  super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
  super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
  trompeloeil_l_expectations_27.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)0x5d;
  Catch::StringRef::StringRef(&local_50,"Invoking as lvalue ref.");
  Catch::Section::Section(&local_3d0,(SourceLineInfo *)&local_1f0,local_50,(char *)0x0);
  bVar2 = Catch::Section::operator_cast_to_bool(&local_3d0);
  if (bVar2) {
    local_1f0.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
         (_func_int **)0x46504a;
    local_1f0.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
         (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)0x5f;
    local_1f0.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
         (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)0x45f81b;
    local_4b0 = (call_matcher<bool_(int),_std::tuple<int>_> *)CONCAT44(local_4b0._4_4_,0x2a);
    local_4c0.file = (char *)&local_2b0;
    mVar5 = GenericOperation1Mock<bool,_int>::trompeloeil_l_tag_type_trompeloeil_27::
            call_lvalue_ref<int>
                      ((trompeloeil_l_tag_type_trompeloeil_27 *)&local_1f0,(int *)&local_4b0);
    prVar4 = (return_handler<bool_(int)> *)operator_new(0x10);
    prVar4->_vptr_return_handler = (_func_int **)&PTR__return_handler_004fa318;
    prVar1 = ((mVar5.matcher)->return_handler_obj)._M_t.
             super___uniq_ptr_impl<trompeloeil::return_handler<bool_(int)>,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_trompeloeil::return_handler<bool_(int)>_*,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
             .super__Head_base<0UL,_trompeloeil::return_handler<bool_(int)>_*,_false>._M_head_impl;
    ((mVar5.matcher)->return_handler_obj)._M_t.
    super___uniq_ptr_impl<trompeloeil::return_handler<bool_(int)>,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_trompeloeil::return_handler<bool_(int)>_*,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
    .super__Head_base<0UL,_trompeloeil::return_handler<bool_(int)>_*,_false>._M_head_impl = prVar4;
    if (prVar1 != (return_handler<bool_(int)> *)0x0) {
      (*prVar1->_vptr_return_handler[1])();
    }
    local_490._0_8_ = "seq";
    local_490._8_8_ = &local_4a8;
    trompeloeil::call_matcher<bool(int),std::tuple<int>>::
    set_sequence<std::pair<char_const*,trompeloeil::sequence&>>
              ((call_matcher<bool(int),std::tuple<int>> *)mVar5.matcher,
               (pair<const_char_*,_trompeloeil::sequence_&> *)local_490);
    local_4d0 = mVar5.matcher;
    trompeloeil::call_validator_t<GenericOperation1Mock<bool,int>&>::
    make_expectation<trompeloeil::call_matcher<bool(int),std::tuple<int>>,GenericOperation1Mock<bool,int>::trompeloeil_l_tag_type_trompeloeil_27,trompeloeil::sequence_injector<trompeloeil::return_injector<bool,trompeloeil::matcher_info<bool(int)>>>>
              ((call_validator_t<GenericOperation1Mock<bool,int>&> *)&local_4c8,&local_4c0);
    local_4c0.file = (char *)&local_370;
    local_1f0.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
         (_func_int **)0x46504a;
    local_1f0.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
         (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)0x63;
    local_1f0.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
         (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)0x45f837;
    local_4a8.next._4_4_ = 0x2a;
    mVar5 = GenericOperation1Mock<bool,_int>::trompeloeil_l_tag_type_trompeloeil_27::
            call_lvalue_ref<int>
                      ((trompeloeil_l_tag_type_trompeloeil_27 *)&local_1f0,
                       (int *)((long)&local_4a8.next + 4));
    prVar4 = (return_handler<bool_(int)> *)operator_new(0x10);
    prVar4->_vptr_return_handler = (_func_int **)&PTR__return_handler_004fa358;
    prVar1 = ((mVar5.matcher)->return_handler_obj)._M_t.
             super___uniq_ptr_impl<trompeloeil::return_handler<bool_(int)>,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_trompeloeil::return_handler<bool_(int)>_*,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
             .super__Head_base<0UL,_trompeloeil::return_handler<bool_(int)>_*,_false>._M_head_impl;
    ((mVar5.matcher)->return_handler_obj)._M_t.
    super___uniq_ptr_impl<trompeloeil::return_handler<bool_(int)>,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_trompeloeil::return_handler<bool_(int)>_*,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
    .super__Head_base<0UL,_trompeloeil::return_handler<bool_(int)>_*,_false>._M_head_impl = prVar4;
    if (prVar1 != (return_handler<bool_(int)> *)0x0) {
      (*prVar1->_vptr_return_handler[1])();
    }
    local_490._0_8_ = "seq";
    local_490._8_8_ = &local_4a8;
    trompeloeil::call_matcher<bool(int),std::tuple<int>>::
    set_sequence<std::pair<char_const*,trompeloeil::sequence&>>
              ((call_matcher<bool(int),std::tuple<int>> *)mVar5.matcher,
               (pair<const_char_*,_trompeloeil::sequence_&> *)local_490);
    local_4b0 = mVar5.matcher;
    trompeloeil::call_validator_t<GenericOperation1Mock<bool,int>&>::
    make_expectation<trompeloeil::call_matcher<bool(int),std::tuple<int>>,GenericOperation1Mock<bool,int>::trompeloeil_l_tag_type_trompeloeil_27,trompeloeil::sequence_injector<trompeloeil::return_injector<bool,trompeloeil::matcher_info<bool(int)>>>>
              ((call_validator_t<GenericOperation1Mock<bool,int>&> *)&local_4d0,&local_4c0);
    sl::functional::
    BasicClosure<GenericOperation1Mock<bool,_int>,_sl::functional::BasicInvokePolicy,_sl::functional::ConjunctionOperator>
    ::BasicClosure<GenericOperation1Mock<bool,_int>_>
              ((BasicClosure<GenericOperation1Mock<bool,_int>,_sl::functional::BasicInvokePolicy,_sl::functional::ConjunctionOperator>
                *)local_490,&local_2b0);
    sl::functional::operator&&<GenericOperation1Mock<bool,_int>_>
              (&local_1f0,
               (BasicClosure<GenericOperation1Mock<bool,_int>,_sl::functional::BasicInvokePolicy,_sl::functional::ConjunctionOperator>
                *)local_490,&local_370);
    sl::functional::
    BasicClosure<GenericOperation1Mock<bool,_int>,_sl::functional::BasicInvokePolicy,_sl::functional::ConjunctionOperator>
    ::~BasicClosure((BasicClosure<GenericOperation1Mock<bool,_int>,_sl::functional::BasicInvokePolicy,_sl::functional::ConjunctionOperator>
                     *)local_490);
    local_4c0.file = (char *)CONCAT44(local_4c0.file._4_4_,0x2a);
    local_490._0_8_ = &local_4c0;
    bVar2 = std::
            __invoke_impl<bool,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_DNKpp[P]Simple_Utility_include_Simple_Utility_functional_mixins_Conjunction_hpp:31:5),_GenericOperation1Mock<bool,_int>_&,_GenericOperation1Mock<bool,_int>_&>
                      (local_490,
                       &local_1f0.m_Fn.m_Functions.
                        super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>
                        .super__Head_base<0UL,_GenericOperation1Mock<bool,_int>,_false>,&local_1f0);
    local_4c0.file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/DNKpp[P]Simple-Utility/tests/functional/mixins/Conjunction.cpp"
    ;
    local_4c0.line = 0x6c;
    macroName_00.m_size = 7;
    macroName_00.m_start = "REQUIRE";
    capturedExpression_00.m_size = 7;
    capturedExpression_00.m_start = "!result";
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_490,macroName_00,&local_4c0,capturedExpression_00,Normal);
    local_4c0.file = (char *)CONCAT71(local_4c0.file._1_7_,!bVar2);
    Catch::AssertionHandler::handleExpr<bool>
              ((AssertionHandler *)local_490,(ExprLhs<bool> *)&local_4c0);
    Catch::AssertionHandler::complete((AssertionHandler *)local_490);
    if (local_490[0x3b] == false) {
      (*local_450->_vptr_list_elem[0x14])();
    }
    sl::functional::
    BasicClosure<sl::functional::Composition<sl::functional::ConjunctionStrategy,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>,_sl::functional::BasicInvokePolicy,_sl::functional::ConjunctionOperator>
    ::~BasicClosure(&local_1f0);
    if (local_4d0 != (call_matcher<bool_(int),_std::tuple<int>_> *)0x0) {
      (*(local_4d0->super_call_matcher_base<bool_(int)>).
        super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem[1])();
    }
    if (local_4c8 != (long *)0x0) {
      (**(code **)(*local_4c8 + 8))();
    }
  }
  Catch::Section::~Section(&local_3d0);
  local_1f0.m_Fn.m_Functions.
  super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
  super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
  super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
  trompeloeil_l_expectations_27.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)0x46504a;
  local_1f0.m_Fn.m_Functions.
  super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
  super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
  super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
  trompeloeil_l_expectations_27.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)0x6f;
  Catch::StringRef::StringRef(&local_60,"Invoking as const rvalue ref.");
  Catch::Section::Section(&local_3d0,(SourceLineInfo *)&local_1f0,local_60,(char *)0x0);
  bVar2 = Catch::Section::operator_cast_to_bool(&local_3d0);
  if (bVar2) {
    local_1f0.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
         (_func_int **)0x46504a;
    local_1f0.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
         (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)0x71;
    local_1f0.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
         (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)0x45f872;
    local_4b0 = (call_matcher<bool_(int),_std::tuple<int>_> *)CONCAT44(local_4b0._4_4_,0x2a);
    local_4c0.file = (char *)&local_2b0;
    mVar6 = GenericOperation1Mock<bool,_int>::trompeloeil_l_tag_type_trompeloeil_30::
            call_const_rvalue_ref<int>
                      ((trompeloeil_l_tag_type_trompeloeil_30 *)&local_1f0,(int *)&local_4b0);
    prVar4 = (return_handler<bool_(int)> *)operator_new(0x10);
    prVar4->_vptr_return_handler = (_func_int **)&PTR__return_handler_004fa398;
    prVar1 = ((mVar6.matcher)->return_handler_obj)._M_t.
             super___uniq_ptr_impl<trompeloeil::return_handler<bool_(int)>,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_trompeloeil::return_handler<bool_(int)>_*,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
             .super__Head_base<0UL,_trompeloeil::return_handler<bool_(int)>_*,_false>._M_head_impl;
    ((mVar6.matcher)->return_handler_obj)._M_t.
    super___uniq_ptr_impl<trompeloeil::return_handler<bool_(int)>,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_trompeloeil::return_handler<bool_(int)>_*,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
    .super__Head_base<0UL,_trompeloeil::return_handler<bool_(int)>_*,_false>._M_head_impl = prVar4;
    if (prVar1 != (return_handler<bool_(int)> *)0x0) {
      (*prVar1->_vptr_return_handler[1])();
    }
    local_490._0_8_ = "seq";
    local_490._8_8_ = &local_4a8;
    trompeloeil::call_matcher<bool(int),std::tuple<int>>::
    set_sequence<std::pair<char_const*,trompeloeil::sequence&>>
              ((call_matcher<bool(int),std::tuple<int>> *)mVar6.matcher,
               (pair<const_char_*,_trompeloeil::sequence_&> *)local_490);
    local_4d0 = mVar6.matcher;
    trompeloeil::call_validator_t<GenericOperation1Mock<bool,int>const&>::
    make_expectation<trompeloeil::call_matcher<bool(int),std::tuple<int>>,GenericOperation1Mock<bool,int>::trompeloeil_l_tag_type_trompeloeil_30,trompeloeil::sequence_injector<trompeloeil::return_injector<bool,trompeloeil::matcher_info<bool(int)>>>>
              ((call_validator_t<GenericOperation1Mock<bool,int>const&> *)&local_4c8,&local_4c0);
    local_4c0.file = (char *)&local_370;
    local_1f0.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
         (_func_int **)0x46504a;
    local_1f0.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
         (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)0x75;
    local_1f0.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
         (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)0x45f894;
    local_4a8.next._4_4_ = 0x2a;
    mVar6 = GenericOperation1Mock<bool,_int>::trompeloeil_l_tag_type_trompeloeil_30::
            call_const_rvalue_ref<int>
                      ((trompeloeil_l_tag_type_trompeloeil_30 *)&local_1f0,
                       (int *)((long)&local_4a8.next + 4));
    prVar4 = (return_handler<bool_(int)> *)operator_new(0x10);
    prVar4->_vptr_return_handler = (_func_int **)&PTR__return_handler_004fa3d8;
    prVar1 = ((mVar6.matcher)->return_handler_obj)._M_t.
             super___uniq_ptr_impl<trompeloeil::return_handler<bool_(int)>,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_trompeloeil::return_handler<bool_(int)>_*,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
             .super__Head_base<0UL,_trompeloeil::return_handler<bool_(int)>_*,_false>._M_head_impl;
    ((mVar6.matcher)->return_handler_obj)._M_t.
    super___uniq_ptr_impl<trompeloeil::return_handler<bool_(int)>,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_trompeloeil::return_handler<bool_(int)>_*,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
    .super__Head_base<0UL,_trompeloeil::return_handler<bool_(int)>_*,_false>._M_head_impl = prVar4;
    if (prVar1 != (return_handler<bool_(int)> *)0x0) {
      (*prVar1->_vptr_return_handler[1])();
    }
    local_490._0_8_ = "seq";
    local_490._8_8_ = &local_4a8;
    trompeloeil::call_matcher<bool(int),std::tuple<int>>::
    set_sequence<std::pair<char_const*,trompeloeil::sequence&>>
              ((call_matcher<bool(int),std::tuple<int>> *)mVar6.matcher,
               (pair<const_char_*,_trompeloeil::sequence_&> *)local_490);
    local_4b0 = mVar6.matcher;
    trompeloeil::call_validator_t<GenericOperation1Mock<bool,int>const&>::
    make_expectation<trompeloeil::call_matcher<bool(int),std::tuple<int>>,GenericOperation1Mock<bool,int>::trompeloeil_l_tag_type_trompeloeil_30,trompeloeil::sequence_injector<trompeloeil::return_injector<bool,trompeloeil::matcher_info<bool(int)>>>>
              ((call_validator_t<GenericOperation1Mock<bool,int>const&> *)&local_4d0,&local_4c0);
    sl::functional::
    BasicClosure<GenericOperation1Mock<bool,_int>,_sl::functional::BasicInvokePolicy,_sl::functional::ConjunctionOperator>
    ::BasicClosure<GenericOperation1Mock<bool,_int>_>
              ((BasicClosure<GenericOperation1Mock<bool,_int>,_sl::functional::BasicInvokePolicy,_sl::functional::ConjunctionOperator>
                *)local_490,&local_2b0);
    sl::functional::operator&&<GenericOperation1Mock<bool,_int>_>
              (&local_1f0,
               (BasicClosure<GenericOperation1Mock<bool,_int>,_sl::functional::BasicInvokePolicy,_sl::functional::ConjunctionOperator>
                *)local_490,&local_370);
    sl::functional::
    BasicClosure<GenericOperation1Mock<bool,_int>,_sl::functional::BasicInvokePolicy,_sl::functional::ConjunctionOperator>
    ::~BasicClosure((BasicClosure<GenericOperation1Mock<bool,_int>,_sl::functional::BasicInvokePolicy,_sl::functional::ConjunctionOperator>
                     *)local_490);
    local_4c0.file = (char *)CONCAT44(local_4c0.file._4_4_,0x2a);
    local_490._0_8_ = &local_4c0;
    bVar2 = std::
            __invoke_impl<bool,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_DNKpp[P]Simple_Utility_include_Simple_Utility_functional_mixins_Conjunction_hpp:31:5),_const_GenericOperation1Mock<bool,_int>,_const_GenericOperation1Mock<bool,_int>_>
                      (local_490,
                       &local_1f0.m_Fn.m_Functions.
                        super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>
                        .super__Head_base<0UL,_GenericOperation1Mock<bool,_int>,_false>,&local_1f0);
    local_4c0.file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/DNKpp[P]Simple-Utility/tests/functional/mixins/Conjunction.cpp"
    ;
    local_4c0.line = 0x7e;
    macroName_01.m_size = 7;
    macroName_01.m_start = "REQUIRE";
    capturedExpression_01.m_size = 7;
    capturedExpression_01.m_start = "!result";
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_490,macroName_01,&local_4c0,capturedExpression_01,Normal);
    local_4c0.file = (char *)CONCAT71(local_4c0.file._1_7_,!bVar2);
    Catch::AssertionHandler::handleExpr<bool>
              ((AssertionHandler *)local_490,(ExprLhs<bool> *)&local_4c0);
    Catch::AssertionHandler::complete((AssertionHandler *)local_490);
    if (local_490[0x3b] == false) {
      (*local_450->_vptr_list_elem[0x14])();
    }
    sl::functional::
    BasicClosure<sl::functional::Composition<sl::functional::ConjunctionStrategy,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>,_sl::functional::BasicInvokePolicy,_sl::functional::ConjunctionOperator>
    ::~BasicClosure(&local_1f0);
    if (local_4d0 != (call_matcher<bool_(int),_std::tuple<int>_> *)0x0) {
      (*(local_4d0->super_call_matcher_base<bool_(int)>).
        super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem[1])();
    }
    if (local_4c8 != (long *)0x0) {
      (**(code **)(*local_4c8 + 8))();
    }
  }
  Catch::Section::~Section(&local_3d0);
  local_1f0.m_Fn.m_Functions.
  super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
  super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
  super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
  trompeloeil_l_expectations_27.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
       (_func_int **)0x46504a;
  local_1f0.m_Fn.m_Functions.
  super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
  super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
  super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
  trompeloeil_l_expectations_27.active.
  super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
  super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
       (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)0x81;
  Catch::StringRef::StringRef(&local_70,"Invoking as rvalue ref.");
  Catch::Section::Section(&local_3d0,(SourceLineInfo *)&local_1f0,local_70,(char *)0x0);
  bVar2 = Catch::Section::operator_cast_to_bool(&local_3d0);
  if (bVar2) {
    local_1f0.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
         (_func_int **)0x46504a;
    local_1f0.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
         (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)0x83;
    local_1f0.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
         (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)0x45f8cf;
    local_4b0 = (call_matcher<bool_(int),_std::tuple<int>_> *)CONCAT44(local_4b0._4_4_,0x2a);
    local_4c0.file = (char *)&local_2b0;
    mVar7 = GenericOperation1Mock<bool,_int>::trompeloeil_l_tag_type_trompeloeil_29::
            call_rvalue_ref<int>
                      ((trompeloeil_l_tag_type_trompeloeil_29 *)&local_1f0,(int *)&local_4b0);
    prVar4 = (return_handler<bool_(int)> *)operator_new(0x10);
    prVar4->_vptr_return_handler = (_func_int **)&PTR__return_handler_004fa418;
    prVar1 = ((mVar7.matcher)->return_handler_obj)._M_t.
             super___uniq_ptr_impl<trompeloeil::return_handler<bool_(int)>,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_trompeloeil::return_handler<bool_(int)>_*,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
             .super__Head_base<0UL,_trompeloeil::return_handler<bool_(int)>_*,_false>._M_head_impl;
    ((mVar7.matcher)->return_handler_obj)._M_t.
    super___uniq_ptr_impl<trompeloeil::return_handler<bool_(int)>,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_trompeloeil::return_handler<bool_(int)>_*,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
    .super__Head_base<0UL,_trompeloeil::return_handler<bool_(int)>_*,_false>._M_head_impl = prVar4;
    if (prVar1 != (return_handler<bool_(int)> *)0x0) {
      (*prVar1->_vptr_return_handler[1])();
    }
    local_490._0_8_ = "seq";
    local_490._8_8_ = &local_4a8;
    trompeloeil::call_matcher<bool(int),std::tuple<int>>::
    set_sequence<std::pair<char_const*,trompeloeil::sequence&>>
              ((call_matcher<bool(int),std::tuple<int>> *)mVar7.matcher,
               (pair<const_char_*,_trompeloeil::sequence_&> *)local_490);
    local_4d0 = mVar7.matcher;
    trompeloeil::call_validator_t<GenericOperation1Mock<bool,int>&>::
    make_expectation<trompeloeil::call_matcher<bool(int),std::tuple<int>>,GenericOperation1Mock<bool,int>::trompeloeil_l_tag_type_trompeloeil_29,trompeloeil::sequence_injector<trompeloeil::return_injector<bool,trompeloeil::matcher_info<bool(int)>>>>
              ((call_validator_t<GenericOperation1Mock<bool,int>&> *)&local_4c8,&local_4c0);
    local_4c0.file = (char *)&local_370;
    local_1f0.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem =
         (_func_int **)0x46504a;
    local_1f0.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.next =
         (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)0x87;
    local_1f0.m_Fn.m_Functions.
    super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>.
    super__Tuple_impl<1UL,_GenericOperation1Mock<bool,_int>_>.
    super__Head_base<1UL,_GenericOperation1Mock<bool,_int>,_false>._M_head_impl.
    trompeloeil_l_expectations_27.active.
    super_list<trompeloeil::call_matcher_base<bool_(int)>,_trompeloeil::ignore_disposer>.
    super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>.prev =
         (list_elem<trompeloeil::call_matcher_base<bool_(int)>_> *)0x45f8eb;
    local_4a8.next._4_4_ = 0x2a;
    mVar7 = GenericOperation1Mock<bool,_int>::trompeloeil_l_tag_type_trompeloeil_29::
            call_rvalue_ref<int>
                      ((trompeloeil_l_tag_type_trompeloeil_29 *)&local_1f0,
                       (int *)((long)&local_4a8.next + 4));
    prVar4 = (return_handler<bool_(int)> *)operator_new(0x10);
    prVar4->_vptr_return_handler = (_func_int **)&PTR__return_handler_004fa458;
    prVar1 = ((mVar7.matcher)->return_handler_obj)._M_t.
             super___uniq_ptr_impl<trompeloeil::return_handler<bool_(int)>,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_trompeloeil::return_handler<bool_(int)>_*,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
             .super__Head_base<0UL,_trompeloeil::return_handler<bool_(int)>_*,_false>._M_head_impl;
    ((mVar7.matcher)->return_handler_obj)._M_t.
    super___uniq_ptr_impl<trompeloeil::return_handler<bool_(int)>,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_trompeloeil::return_handler<bool_(int)>_*,_std::default_delete<trompeloeil::return_handler<bool_(int)>_>_>
    .super__Head_base<0UL,_trompeloeil::return_handler<bool_(int)>_*,_false>._M_head_impl = prVar4;
    if (prVar1 != (return_handler<bool_(int)> *)0x0) {
      (*prVar1->_vptr_return_handler[1])();
    }
    local_490._0_8_ = "seq";
    local_490._8_8_ = &local_4a8;
    trompeloeil::call_matcher<bool(int),std::tuple<int>>::
    set_sequence<std::pair<char_const*,trompeloeil::sequence&>>
              ((call_matcher<bool(int),std::tuple<int>> *)mVar7.matcher,
               (pair<const_char_*,_trompeloeil::sequence_&> *)local_490);
    local_4b0 = mVar7.matcher;
    trompeloeil::call_validator_t<GenericOperation1Mock<bool,int>&>::
    make_expectation<trompeloeil::call_matcher<bool(int),std::tuple<int>>,GenericOperation1Mock<bool,int>::trompeloeil_l_tag_type_trompeloeil_29,trompeloeil::sequence_injector<trompeloeil::return_injector<bool,trompeloeil::matcher_info<bool(int)>>>>
              ((call_validator_t<GenericOperation1Mock<bool,int>&> *)&local_4d0,&local_4c0);
    sl::functional::
    BasicClosure<GenericOperation1Mock<bool,_int>,_sl::functional::BasicInvokePolicy,_sl::functional::ConjunctionOperator>
    ::BasicClosure<GenericOperation1Mock<bool,_int>_>
              ((BasicClosure<GenericOperation1Mock<bool,_int>,_sl::functional::BasicInvokePolicy,_sl::functional::ConjunctionOperator>
                *)local_490,&local_2b0);
    sl::functional::operator&&<GenericOperation1Mock<bool,_int>_>
              (&local_1f0,
               (BasicClosure<GenericOperation1Mock<bool,_int>,_sl::functional::BasicInvokePolicy,_sl::functional::ConjunctionOperator>
                *)local_490,&local_370);
    sl::functional::
    BasicClosure<GenericOperation1Mock<bool,_int>,_sl::functional::BasicInvokePolicy,_sl::functional::ConjunctionOperator>
    ::~BasicClosure((BasicClosure<GenericOperation1Mock<bool,_int>,_sl::functional::BasicInvokePolicy,_sl::functional::ConjunctionOperator>
                     *)local_490);
    local_4c0.file = (char *)CONCAT44(local_4c0.file._4_4_,0x2a);
    local_490._0_8_ = &local_4c0;
    bVar2 = std::
            __invoke_impl<bool,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_DNKpp[P]Simple_Utility_include_Simple_Utility_functional_mixins_Conjunction_hpp:31:5),_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>
                      (local_490,
                       &local_1f0.m_Fn.m_Functions.
                        super__Tuple_impl<0UL,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>
                        .super__Head_base<0UL,_GenericOperation1Mock<bool,_int>,_false>,&local_1f0);
    local_4c0.file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/DNKpp[P]Simple-Utility/tests/functional/mixins/Conjunction.cpp"
    ;
    local_4c0.line = 0x90;
    macroName_02.m_size = 7;
    macroName_02.m_start = "REQUIRE";
    capturedExpression_02.m_size = 7;
    capturedExpression_02.m_start = "!result";
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_490,macroName_02,&local_4c0,capturedExpression_02,Normal);
    local_4c0.file = (char *)CONCAT71(local_4c0.file._1_7_,!bVar2);
    Catch::AssertionHandler::handleExpr<bool>
              ((AssertionHandler *)local_490,(ExprLhs<bool> *)&local_4c0);
    Catch::AssertionHandler::complete((AssertionHandler *)local_490);
    if (local_490[0x3b] == false) {
      (*local_450->_vptr_list_elem[0x14])();
    }
    sl::functional::
    BasicClosure<sl::functional::Composition<sl::functional::ConjunctionStrategy,_GenericOperation1Mock<bool,_int>,_GenericOperation1Mock<bool,_int>_>,_sl::functional::BasicInvokePolicy,_sl::functional::ConjunctionOperator>
    ::~BasicClosure(&local_1f0);
    if (local_4d0 != (call_matcher<bool_(int),_std::tuple<int>_> *)0x0) {
      (*(local_4d0->super_call_matcher_base<bool_(int)>).
        super_list_elem<trompeloeil::call_matcher_base<bool_(int)>_>._vptr_list_elem[1])();
    }
    if (local_4c8 != (long *)0x0) {
      (**(code **)(*local_4c8 + 8))();
    }
  }
  Catch::Section::~Section(&local_3d0);
  std::unique_ptr<trompeloeil::sequence_type,_std::default_delete<trompeloeil::sequence_type>_>::
  ~unique_ptr((unique_ptr<trompeloeil::sequence_type,_std::default_delete<trompeloeil::sequence_type>_>
               *)&local_4a8);
  trompeloeil::expectations<true,_bool_(int)>::~expectations(this);
  trompeloeil::expectations<true,_bool_(int)>::~expectations
            (&local_370.trompeloeil_l_expectations_29);
  trompeloeil::expectations<true,_bool_(int)>::~expectations
            (&local_370.trompeloeil_l_expectations_28);
  trompeloeil::expectations<true,_bool_(int)>::~expectations
            (&local_370.trompeloeil_l_expectations_27);
  trompeloeil::expectations<true,_bool_(int)>::~expectations
            ((expectations<true,_bool_(int)> *)local_4a8.prev);
  trompeloeil::expectations<true,_bool_(int)>::~expectations
            (&local_2b0.trompeloeil_l_expectations_29);
  trompeloeil::expectations<true,_bool_(int)>::~expectations
            (&local_2b0.trompeloeil_l_expectations_28);
  trompeloeil::expectations<true,_bool_(int)>::~expectations
            (&local_2b0.trompeloeil_l_expectations_27);
  return;
}

Assistant:

constexpr value_t(int a)
			: a{ a }
		{ }